

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButtonPrivate::fixFocusPolicy(QAbstractButtonPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  QWidget *pQVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *b;
  int i;
  QAbstractButton *q;
  QList<QAbstractButton_*> buttonList;
  undefined4 in_stack_ffffffffffffff98;
  FocusPolicy in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  FocusPolicy in_stack_ffffffffffffffa4;
  int local_34;
  QList<QAbstractButton_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &q_func(in_RDI)->super_QWidget;
  if ((in_RDI->group != (QButtonGroup *)0x0) || (((byte)in_RDI->field_0x28c >> 3 & 1) != 0)) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    queryButtonList(in_RDI);
    for (local_34 = 0; qVar3 = QList<QAbstractButton_*>::size(&local_20), local_34 < qVar3;
        local_34 = local_34 + 1) {
      ppQVar4 = QList<QAbstractButton_*>::at
                          ((QList<QAbstractButton_*> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      this_00 = &(*ppQVar4)->super_QWidget;
      bVar1 = QAbstractButton::isCheckable
                        ((QAbstractButton *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (bVar1) {
        if ((this_00 == pQVar2) ||
           (bVar1 = QAbstractButton::isCheckable
                              ((QAbstractButton *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
           !bVar1)) {
          in_stack_ffffffffffffffa4 = QWidget::focusPolicy(this_00);
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 | TabFocus;
        }
        else {
          in_stack_ffffffffffffffa4 = QWidget::focusPolicy(this_00);
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & ~TabFocus;
        }
        QWidget::setFocusPolicy
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
      }
    }
    QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x4ff045);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::fixFocusPolicy()
{
    Q_Q(QAbstractButton);
#if QT_CONFIG(buttongroup)
    if (!group && !autoExclusive)
#else
    if (!autoExclusive)
#endif
        return;

    QList<QAbstractButton *> buttonList = queryButtonList();
    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *b = buttonList.at(i);
        if (!b->isCheckable())
            continue;
        b->setFocusPolicy((Qt::FocusPolicy) ((b == q || !q->isCheckable())
                                         ? (b->focusPolicy() | Qt::TabFocus)
                                         :  (b->focusPolicy() & ~Qt::TabFocus)));
    }
}